

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tempseat.c
# Opt level: O2

_Bool tempseat_eof(Seat *seat)

{
  __assert_fail("false && \"eof should never be called on TempSeat\"",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/tempseat.c"
                ,0x138,"_Bool tempseat_eof(Seat *)");
}

Assistant:

static bool tempseat_eof(Seat *seat)
{
    /*
     * EOF is _very nearly_ something that we could buffer, and pass
     * on to the real Seat at flush time. The only difficulty is that
     * sometimes the front end wants to respond to an incoming EOF by
     * instructing the back end to send an outgoing one, which it does
     * by returning a bool from its eof method.
     *
     * So we'd have to arrange that tempseat_flush caught that return
     * value and passed it on to the calling backend. And then every
     * backend would have to deal with tempseat_flush maybe returning
     * it an 'actually, please start closing down now' indication,
     * which could only happen _in theory_, if it had for some reason
     * called seat_eof on the TempSeat.
     *
     * But in fact, we don't expect back ends to call seat_eof on the
     * TempSeat in the first place, so all of that effort would be a
     * total waste. Hence, we'll put EOF in the category of things we
     * expect backends never to do while the real Seat is out on loan.
     */
    unreachable("eof should never be called on TempSeat");
}